

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void do_opt(int *ip)

{
  int iVar1;
  ushort **ppuVar2;
  int local_40;
  undefined4 local_3c;
  int i;
  int opt;
  char name [32];
  char flag;
  char c;
  int *ip_local;
  
  while( true ) {
    do {
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)prlnbuf[*ip]] & 0x2000) != 0) {
        *ip = *ip + 1;
      }
      iVar1 = *ip;
      *ip = iVar1 + 1;
      name[0x1f] = prlnbuf[iVar1];
    } while (name[0x1f] == ',');
    if ((name[0x1f] == ';') || (name[0x1f] == '\0')) break;
    local_40 = 0;
    while( true ) {
      do {
      } while (name[0x1f] == ' ');
      if (((name[0x1f] == ',') || (name[0x1f] == ';')) || (name[0x1f] == '\0')) break;
      if (0x1f < local_40) {
        error("Syntax error!");
        return;
      }
      *(char *)((long)&i + (long)local_40) = name[0x1f];
      iVar1 = *ip;
      *ip = iVar1 + 1;
      name[0x1f] = prlnbuf[iVar1];
      local_40 = local_40 + 1;
    }
    *(undefined1 *)((long)&i + (long)local_40) = 0;
    name[0x1e] = *(char *)((long)&i + (long)(local_40 + -1));
    *(undefined1 *)((long)&i + (long)(local_40 + -1)) = 0;
    iVar1 = strcasecmp((char *)&i,"l");
    if (iVar1 == 0) {
      local_3c = 0;
    }
    else {
      iVar1 = strcasecmp((char *)&i,"m");
      if (iVar1 == 0) {
        local_3c = 1;
      }
      else {
        iVar1 = strcasecmp((char *)&i,"w");
        if (iVar1 == 0) {
          local_3c = 2;
        }
        else {
          iVar1 = strcasecmp((char *)&i,"o");
          if (iVar1 != 0) {
            error("Unknown option!");
            return;
          }
          local_3c = 3;
        }
      }
    }
    if (name[0x1e] == '+') {
      asm_opt[local_3c] = 1;
    }
    if (name[0x1e] == '-') {
      asm_opt[local_3c] = 0;
    }
  }
  if (pass != 1) {
    return;
  }
  println();
  return;
}

Assistant:

void
do_opt(int *ip)
{
	char c;
	char flag;
	char name[32];
	int  opt;
	int  i;

	for (;;) {
		/* skip spaces */
		while (isspace(prlnbuf[*ip]))
			(*ip)++;

		/* get char */
		c = prlnbuf[(*ip)++];

		/* no option */
		if (c == ',')
			continue;

		/* end of line */
		if (c == ';' || c == '\0')
			break;

		/* extract option */
		i = 0;
		for (;;) {
			if (c == ' ')
				continue;
			if (c == ',' || c == ';' || c == '\0')
				break;
			if (i > 31) {
				error("Syntax error!");
				return;
			}
			name[i++] = c;
			c = prlnbuf[(*ip)++];
		}

		/* get option flag */
		name[i] = '\0';
		flag = name[--i];
		name[i] = '\0';

		/* search option */
		if (!strcasecmp(name, "l"))
			opt = OPT_LIST;
		else if (!strcasecmp(name, "m"))
			opt = OPT_MACRO;
		else if (!strcasecmp(name, "w"))
			opt = OPT_WARNING;
		else if (!strcasecmp(name, "o"))
			opt = OPT_OPTIMIZE;
		else {
			error("Unknown option!");
			return;
		}

		/* set option */
		if (flag == '+')
			asm_opt[opt] = 1;
		if (flag == '-')
			asm_opt[opt] = 0;
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}